

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerfd-root-test.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  
  iVar1 = microatf_tp_main(argc,argv,microatf_tp_add_tcs);
  return iVar1;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, timerfd_root__zero_read_on_abs_realtime);
	ATF_TP_ADD_TC(tp, timerfd_root__read_on_abs_realtime_no_interval);
	ATF_TP_ADD_TC(tp, timerfd_root__cancel_on_set);
	ATF_TP_ADD_TC(tp, timerfd_root__cancel_on_set_init);
	ATF_TP_ADD_TC(tp, timerfd_root__clock_change_notification);
	ATF_TP_ADD_TC(tp, timerfd_root__advance_time_no_cancel);

	return atf_no_error();
}